

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

vector<WorldPath_*,_std::allocator<WorldPath_*>_> * __thiscall
WorldShuffler::build_weighted_blocked_paths_list
          (vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__return_storage_ptr__,
          WorldShuffler *this)

{
  Item *pIVar1;
  long lVar2;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *pvVar3;
  undefined8 uVar4;
  pointer ppIVar5;
  pointer ppWVar6;
  size_type sVar7;
  mapped_type_conflict2 *pmVar8;
  _Rb_tree_node_base *p_Var9;
  Json *this_00;
  reference this_01;
  int i;
  uint uVar10;
  pointer ppIVar11;
  WorldPath *path;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  quantities_to_place;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> weighted_blocked_paths;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  WorldPath *local_108;
  WorldSolver *local_100;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *local_f8;
  WorldShuffler *local_f0;
  pointer local_e8;
  pointer local_e0;
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_short>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_short>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  local_d8;
  _Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_> local_a8;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100 = &this->_solver;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppWVar6 = (this->_solver)._blocked_paths.
            super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_e8 = (this->_solver)._blocked_paths.
             super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_f8 = __return_storage_ptr__;
  local_f0 = this;
  do {
    if (ppWVar6 == local_e8) {
      vectools::shuffle<WorldPath*>
                ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)&local_a8,&local_f0->_rng);
      pvVar3 = local_f8;
      (local_f8->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
      super__Vector_impl_data._M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
      (local_f8->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
      (local_f8->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>::~_Vector_base(&local_a8);
      return pvVar3;
    }
    local_108 = *ppWVar6;
    local_e0 = ppWVar6;
    WorldSolver::missing_nodes_to_take_path
              ((vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_d8,local_100,local_108);
    uVar4 = local_d8._M_impl._0_8_;
    lVar2 = CONCAT44(local_d8._M_impl.super__Rb_tree_header._M_header._4_4_,
                     local_d8._M_impl.super__Rb_tree_header._M_header._M_color);
    std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base
              ((_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_d8);
    if (uVar4 == lVar2) {
      WorldSolver::missing_items_to_take_path
                ((vector<Item_*,_std::allocator<Item_*>_> *)&local_88,local_100,local_108);
      ppIVar5 = local_88._M_impl.super__Vector_impl_data._M_finish;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_d8._M_impl.super__Rb_tree_header._M_header;
      local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
      for (ppIVar11 = local_88._M_impl.super__Vector_impl_data._M_start;
          p_Var9 = local_d8._M_impl.super__Rb_tree_header._M_header._M_left, ppIVar11 != ppIVar5;
          ppIVar11 = ppIVar11 + 1) {
        pIVar1 = *ppIVar11;
        local_70._M_dataplus._M_p._0_1_ = pIVar1->_id;
        sVar7 = std::
                map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                ::count((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                         *)&local_d8,(key_type_conflict *)&local_70);
        if (sVar7 == 0) {
          local_70._M_dataplus._M_p._0_1_ = pIVar1->_id;
          pmVar8 = std::
                   map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                   ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                                 *)&local_d8,(key_type_conflict *)&local_70);
          *pmVar8 = 0;
        }
        local_70._M_dataplus._M_p._0_1_ = pIVar1->_id;
        pmVar8 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                               *)&local_d8,(key_type_conflict *)&local_70);
        *pmVar8 = *pmVar8 + 1;
      }
      for (; (_Rb_tree_header *)p_Var9 != &local_d8._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        pmVar8 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::operator[](&this->_item_pool_quantities,(key_type_conflict *)(p_Var9 + 1));
        if (*pmVar8 < (ushort)*(undefined2 *)((long)&p_Var9[1]._M_color + 2)) goto LAB_0017a8a6;
      }
      for (uVar10 = 0; uVar10 < local_108->_weight; uVar10 = uVar10 + 1) {
        std::vector<WorldPath*,std::allocator<WorldPath*>>::emplace_back<WorldPath*&>
                  ((vector<WorldPath*,std::allocator<WorldPath*>> *)&local_a8,&local_108);
      }
      this_00 = WorldSolver::debug_log_for_current_step_abi_cxx11_(local_100);
      this_01 = nlohmann::
                basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)this_00,"blockedPaths");
      std::operator+(&local_50,&local_108->_from_node->_id," --> ");
      std::operator+(&local_70,&local_50,&local_108->_to_node->_id);
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)this_01,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
LAB_0017a8a6:
      std::
      _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_short>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_short>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
      ::~_Rb_tree(&local_d8);
      std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_88);
    }
    ppWVar6 = local_e0 + 1;
  } while( true );
}

Assistant:

std::vector<WorldPath*> WorldShuffler::build_weighted_blocked_paths_list()
{
    const std::vector<WorldPath*>& blocked_paths = _solver.blocked_paths();
    std::vector<WorldPath*> weighted_blocked_paths;

    for (WorldPath* path : blocked_paths)
    {
        // If items are not the (only) blocking point for taking this path, let it go
        if(!_solver.missing_nodes_to_take_path(path).empty())
            continue;

        // If all items cannot be placed since the item pool is running out of that item type,
        // do not try to open this path. It will open by itself once the item (as placed inside plando)
        // will be reached.
        std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path);
        std::map<uint8_t, uint16_t> quantities_to_place;
        for(Item* item : items_to_place)
        {
            if(!quantities_to_place.count(item->id()))
                quantities_to_place[item->id()] = 0;
            quantities_to_place[item->id()] += 1;
        }

        bool can_place_all_items = true;
        for(auto& [item_id, quantity_to_place] : quantities_to_place)
        {
            if(_item_pool_quantities[item_id] < quantity_to_place)
            {
                can_place_all_items = false;
                break;
            }
        }

        if(can_place_all_items)
        {
            for(int i=0 ; i<path->weight() ; ++i)
                weighted_blocked_paths.emplace_back(path);

            // All conditions are met, add this path to the weighted blocked paths list
            Json& debug_log = _solver.debug_log_for_current_step();
            debug_log["blockedPaths"].emplace_back(path->origin()->id() + " --> " + path->destination()->id());
        }
    }

    vectools::shuffle(weighted_blocked_paths, _rng);
    return std::move(weighted_blocked_paths);
}